

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# share.c
# Opt level: O0

CURLSHcode curl_share_cleanup(Curl_share *share)

{
  ulong local_20;
  size_t i;
  Curl_share *share_local;
  
  if (share == (Curl_share *)0x0) {
    share_local._4_4_ = CURLSHE_INVALID;
  }
  else {
    if (share->lockfunc != (curl_lock_function)0x0) {
      (*share->lockfunc)((CURL *)0x0,CURL_LOCK_DATA_SHARE,CURL_LOCK_ACCESS_SINGLE,share->clientdata)
      ;
    }
    if (share->dirty == 0) {
      Curl_conncache_close_all_connections(&share->conn_cache);
      Curl_conncache_destroy(&share->conn_cache);
      Curl_hash_destroy(&share->hostcache);
      Curl_cookie_cleanup(share->cookies);
      if (share->sslsession != (curl_ssl_session *)0x0) {
        for (local_20 = 0; local_20 < share->max_ssl_sessions; local_20 = local_20 + 1) {
          Curl_ssl_kill_session(share->sslsession + local_20);
        }
        (*Curl_cfree)(share->sslsession);
      }
      if (share->unlockfunc != (curl_unlock_function)0x0) {
        (*share->unlockfunc)((CURL *)0x0,CURL_LOCK_DATA_SHARE,share->clientdata);
      }
      (*Curl_cfree)(share);
      share_local._4_4_ = CURLSHE_OK;
    }
    else {
      if (share->unlockfunc != (curl_unlock_function)0x0) {
        (*share->unlockfunc)((CURL *)0x0,CURL_LOCK_DATA_SHARE,share->clientdata);
      }
      share_local._4_4_ = CURLSHE_IN_USE;
    }
  }
  return share_local._4_4_;
}

Assistant:

CURLSHcode
curl_share_cleanup(struct Curl_share *share)
{
  if(share == NULL)
    return CURLSHE_INVALID;

  if(share->lockfunc)
    share->lockfunc(NULL, CURL_LOCK_DATA_SHARE, CURL_LOCK_ACCESS_SINGLE,
                    share->clientdata);

  if(share->dirty) {
    if(share->unlockfunc)
      share->unlockfunc(NULL, CURL_LOCK_DATA_SHARE, share->clientdata);
    return CURLSHE_IN_USE;
  }

  Curl_conncache_close_all_connections(&share->conn_cache);
  Curl_conncache_destroy(&share->conn_cache);
  Curl_hash_destroy(&share->hostcache);

#if !defined(CURL_DISABLE_HTTP) && !defined(CURL_DISABLE_COOKIES)
  Curl_cookie_cleanup(share->cookies);
#endif

#ifdef USE_SSL
  if(share->sslsession) {
    size_t i;
    for(i = 0; i < share->max_ssl_sessions; i++)
      Curl_ssl_kill_session(&(share->sslsession[i]));
    free(share->sslsession);
  }
#endif

  Curl_psl_destroy(&share->psl);

  if(share->unlockfunc)
    share->unlockfunc(NULL, CURL_LOCK_DATA_SHARE, share->clientdata);
  free(share);

  return CURLSHE_OK;
}